

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

RSDoublelinCameraPose * outputSwitchDirection<RSDoublelinCameraPose>(RSDoublelinCameraPose *in)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  RSDoublelinCameraPose *out;
  RSDoublelinCameraPose *in_RDI;
  
  uVar4 = *(undefined4 *)
           (in->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array;
  uVar5 = *(uint *)((long)(in->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 4);
  uVar6 = *(uint *)((long)(in->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 0xc);
  *(undefined4 *)
   (in_RDI->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array =
       *(undefined4 *)
        ((in->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        + 1);
  *(uint *)((long)(in_RDI->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array + 4) = uVar6 ^ 0x80000000;
  *(undefined4 *)
   ((in_RDI->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
   + 1) = uVar4;
  *(uint *)((long)(in_RDI->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array + 0xc) = uVar5 ^ 0x80000000;
  (in_RDI->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = -(in->v).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
  uVar4 = *(undefined4 *)
           (in->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array;
  uVar5 = *(uint *)((long)(in->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 4);
  uVar6 = *(uint *)((long)(in->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 0xc);
  *(undefined4 *)
   (in_RDI->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array =
       *(undefined4 *)
        ((in->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        + 1);
  *(uint *)((long)(in_RDI->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array + 4) = uVar6 ^ 0x80000000;
  *(undefined4 *)
   ((in_RDI->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
   + 1) = uVar4;
  *(uint *)((long)(in_RDI->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array + 0xc) = uVar5 ^ 0x80000000;
  (in_RDI->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = -(in->w).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
  auVar1 = *(undefined1 (*) [16])
            (in->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array;
  auVar2._8_4_ = auVar1._0_4_;
  auVar2._0_8_ = auVar1._8_8_;
  auVar2._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])
   (in_RDI->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array =
       auVar2;
  (in_RDI->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (in->C).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
         [2];
  auVar1 = *(undefined1 (*) [16])
            (in->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array;
  auVar3._8_4_ = auVar1._0_4_;
  auVar3._0_8_ = auVar1._8_8_;
  auVar3._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])
   (in_RDI->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array =
       auVar3;
  dVar7 = in->f;
  (in_RDI->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (in->t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
         [2];
  in_RDI->f = dVar7;
  in_RDI->rd = in->rd;
  return in_RDI;
}

Assistant:

T outputSwitchDirection(const T & in){
	T out;
	out.v(0) = - in.v(1);
	out.v(1) = - in.v(0);
	out.v(2) = - in.v(2);
	out.w(0) = - in.w(1);
	out.w(1) = - in.w(0);
	out.w(2) = - in.w(2);
	out.C(0) = in.C(1);
	out.C(1) = in.C(0);
	out.C(2) = in.C(2);
	out.t(0) = in.t(1);
	out.t(1) = in.t(0);
	out.t(2) = in.t(2);	
	out.f = in.f;
	out.rd = in.rd;

	return out;
}